

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_arithmetic.c
# Opt level: O1

t_int * over_perf8(t_int *w)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  t_int tVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  
  tVar16 = w[4];
  if ((int)tVar16 != 0) {
    lVar17 = w[3];
    lVar18 = w[1];
    lVar19 = w[2];
    lVar20 = 0;
    do {
      fVar1 = *(float *)(lVar18 + 4 + lVar20 * 4);
      fVar2 = *(float *)(lVar18 + 8 + lVar20 * 4);
      fVar3 = *(float *)(lVar18 + 0xc + lVar20 * 4);
      fVar4 = *(float *)(lVar18 + 0x10 + lVar20 * 4);
      fVar5 = *(float *)(lVar18 + 0x14 + lVar20 * 4);
      fVar6 = *(float *)(lVar18 + 0x18 + lVar20 * 4);
      fVar7 = *(float *)(lVar18 + 0x1c + lVar20 * 4);
      fVar8 = *(float *)(lVar19 + lVar20 * 4);
      fVar9 = *(float *)(lVar19 + 4 + lVar20 * 4);
      fVar10 = *(float *)(lVar19 + 8 + lVar20 * 4);
      fVar11 = *(float *)(lVar19 + 0xc + lVar20 * 4);
      fVar12 = *(float *)(lVar19 + 0x10 + lVar20 * 4);
      fVar13 = *(float *)(lVar19 + 0x14 + lVar20 * 4);
      fVar14 = *(float *)(lVar19 + 0x18 + lVar20 * 4);
      fVar15 = *(float *)(lVar19 + 0x1c + lVar20 * 4);
      *(uint *)(lVar17 + lVar20 * 4) =
           -(uint)(fVar8 != 0.0) & (uint)(*(float *)(lVar18 + lVar20 * 4) / fVar8);
      *(uint *)(lVar17 + 4 + lVar20 * 4) = -(uint)(fVar9 != 0.0) & (uint)(fVar1 / fVar9);
      *(uint *)(lVar17 + 8 + lVar20 * 4) = -(uint)(fVar10 != 0.0) & (uint)(fVar2 / fVar10);
      *(uint *)(lVar17 + 0xc + lVar20 * 4) = -(uint)(fVar11 != 0.0) & (uint)(fVar3 / fVar11);
      *(uint *)(lVar17 + 0x10 + lVar20 * 4) = -(uint)(fVar12 != 0.0) & (uint)(fVar4 / fVar12);
      *(uint *)(lVar17 + 0x14 + lVar20 * 4) = -(uint)(fVar13 != 0.0) & (uint)(fVar5 / fVar13);
      *(uint *)(lVar17 + 0x18 + lVar20 * 4) = -(uint)(fVar14 != 0.0) & (uint)(fVar6 / fVar14);
      *(uint *)(lVar17 + 0x1c + lVar20 * 4) = -(uint)(fVar15 != 0.0) & (uint)(fVar7 / fVar15);
      lVar20 = lVar20 + 8;
    } while ((int)tVar16 != (int)lVar20);
  }
  return w + 5;
}

Assistant:

t_int *over_perf8(t_int *w)
{
    t_sample *in1 = (t_sample *)(w[1]);
    t_sample *in2 = (t_sample *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    int n = (int)(w[4]);
    for (; n; n -= 8, in1 += 8, in2 += 8, out += 8)
    {
        t_sample f0 = in1[0], f1 = in1[1], f2 = in1[2], f3 = in1[3];
        t_sample f4 = in1[4], f5 = in1[5], f6 = in1[6], f7 = in1[7];

        t_sample g0 = in2[0], g1 = in2[1], g2 = in2[2], g3 = in2[3];
        t_sample g4 = in2[4], g5 = in2[5], g6 = in2[6], g7 = in2[7];

        out[0] = (g0? f0 / g0 : 0);
        out[1] = (g1? f1 / g1 : 0);
        out[2] = (g2? f2 / g2 : 0);
        out[3] = (g3? f3 / g3 : 0);
        out[4] = (g4? f4 / g4 : 0);
        out[5] = (g5? f5 / g5 : 0);
        out[6] = (g6? f6 / g6 : 0);
        out[7] = (g7? f7 / g7 : 0);
    }
    return (w+5);
}